

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_adapt.c
# Opt level: O0

int arkAdaptImExGus(ARKodeHAdaptMem hadapt_mem,int k,long nst,realtype hcur,realtype ecur,
                   realtype *hnew)

{
  double dVar1;
  double *in_RCX;
  long in_RDX;
  long in_RDI;
  double in_XMM0_Qa;
  realtype rVar2;
  realtype rVar3;
  realtype h_acc;
  realtype hrat;
  realtype e2;
  realtype e1;
  realtype k3;
  realtype k2;
  realtype k1;
  realtype in_stack_ffffffffffffff28;
  double local_c0;
  double local_68;
  
  if (in_RDX < 2) {
    rVar2 = SUNRpowerR(in_stack_ffffffffffffff28,9.05951277734006e-317);
    local_68 = in_XMM0_Qa * rVar2;
  }
  else {
    dVar1 = *(double *)(in_RDI + 0x50);
    rVar2 = SUNRpowerR(in_stack_ffffffffffffff28,9.05973708314327e-317);
    rVar3 = SUNRpowerR(in_stack_ffffffffffffff28,9.0597578339004e-317);
    local_c0 = in_XMM0_Qa * (in_XMM0_Qa / dVar1) * rVar2 * rVar3;
    rVar2 = SUNRpowerR(in_stack_ffffffffffffff28,9.05979192442996e-317);
    rVar3 = SUNRpowerR(in_stack_ffffffffffffff28,9.05981267518709e-317);
    if (in_XMM0_Qa * rVar2 * rVar3 <= local_c0) {
      rVar2 = SUNRpowerR(in_stack_ffffffffffffff28,9.05985071824182e-317);
      rVar3 = SUNRpowerR(in_stack_ffffffffffffff28,9.05987146899894e-317);
      local_c0 = in_XMM0_Qa * rVar2 * rVar3;
    }
    local_68 = local_c0;
  }
  *in_RCX = local_68;
  return 0;
}

Assistant:

int arkAdaptImExGus(ARKodeHAdaptMem hadapt_mem, int k, long int nst,
                    realtype hcur, realtype ecur, realtype *hnew)
{
  realtype k1, k2, k3, e1, e2, hrat, h_acc;

  /* modified method for first step */
  if (nst < 2) {

    k1 = -ONE / k;
    e1 = SUNMAX(ecur, TINY);
    h_acc = hcur * SUNRpowerR(e1,k1);

  /* general estimate */
  } else {

    k1 = -hadapt_mem->k1 / k;
    k2 = -hadapt_mem->k2 / k;
    k3 = -hadapt_mem->k3 / k;
    e1 = SUNMAX(ecur, TINY);
    e2 = e1 / SUNMAX(hadapt_mem->ehist[0], TINY);
    hrat = hcur / hadapt_mem->hhist[0];
    /* implicit estimate */
    h_acc = hcur * hrat * SUNRpowerR(e1,k3) * SUNRpowerR(e2,k3);
    /* explicit estimate */
    h_acc = SUNMIN(h_acc, hcur * SUNRpowerR(e1,k1) * SUNRpowerR(e2,k2));

  }
  *hnew = h_acc;

  return(ARK_SUCCESS);
}